

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_inflator.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ZLIBBufferInflator::InitializeStream(ZLIBBufferInflator *this)

{
  ostream *poVar1;
  CompressorException *this_00;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  int local_14;
  ZLIBBufferInflator *pZStack_10;
  int ret;
  ZLIBBufferInflator *this_local;
  
  (this->stream_).zalloc = (alloc_func)0x0;
  (this->stream_).zfree = (free_func)0x0;
  (this->stream_).opaque = (voidpf)0x0;
  (this->stream_).avail_in = 0;
  (this->stream_).next_in = (Bytef *)0x0;
  pZStack_10 = this;
  local_14 = inflateInit2_(&this->stream_,0xfffffff1,"1.2.11",0x70);
  if (local_14 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = std::operator<<(local_190,
                             "problem occurred while initializing stream: ZLIB_ERROR_CODE(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
    std::operator<<(poVar1,")");
    this_00 = (CompressorException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringstream::str();
    exceptions::CompressorException::CompressorException(this_00,&local_1d0);
    __cxa_throw(this_00,&exceptions::CompressorException::typeinfo,
                exceptions::CompressorException::~CompressorException);
  }
  return;
}

Assistant:

void ZLIBBufferInflator::InitializeStream()
{
    /* allocate inflate state */
    stream_.zalloc = Z_NULL;
    stream_.zfree = Z_NULL;
    stream_.opaque = Z_NULL;
    stream_.avail_in = 0;
    stream_.next_in = Z_NULL;
    int ret = inflateInit2(&stream_, -MAX_WBITS);
    if (ret != Z_OK)
    {
        std::stringstream ss;
        ss << "problem occurred while initializing stream: ZLIB_ERROR_CODE(" << ret << ")";
        throw CompressorException(ss.str());
    }
}